

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O0

void __thiscall QtMWidgets::TableViewCell::TableViewCell(TableViewCell *this,QWidget *parent)

{
  TableViewCellPrivate *this_00;
  TableViewCellPrivate *this_01;
  QFlags<Qt::WindowType> local_1c;
  QWidget *local_18;
  QWidget *parent_local;
  TableViewCell *this_local;
  
  local_18 = parent;
  parent_local = &this->super_QWidget;
  QFlags<Qt::WindowType>::QFlags(&local_1c);
  QWidget::QWidget(&this->super_QWidget,parent,(QFlags_conflict1 *)(ulong)local_1c.i);
  *(undefined ***)this = &PTR_metaObject_002433b8;
  *(undefined ***)&this->field_0x10 = &PTR__TableViewCell_00243568;
  this_00 = (TableViewCellPrivate *)operator_new(0x50);
  TableViewCellPrivate::TableViewCellPrivate(this_00,this);
  QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
  ::QScopedPointer(&this->d,this_00);
  this_01 = QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
            ::operator->(&this->d);
  TableViewCellPrivate::init(this_01,(EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

TableViewCell::TableViewCell( QWidget * parent )
	:	QWidget( parent )
	,	d( new TableViewCellPrivate( this ) )
{
	d->init();
}